

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

strong_ordering __thiscall
QCborMap::compareThreeWay_helper(QCborMap *this,QCborMap *lhs,QCborValueConstRef rhs)

{
  int iVar1;
  QCborContainerPrivate *pQVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pQVar2 = lhs[6].d.d.ptr;
  iVar1 = (int)(&pQVar2->usedData)[(long)rhs.d * 2];
  uVar4 = 0xffffffe0;
  if (iVar1 < 0x10000) {
    uVar4 = (ulong)(0xa0 - iVar1);
  }
  if ((int)uVar4 == 0) {
    uVar3 = compareContainer((this->d).d.ptr,
                             *(QCborContainerPrivate **)
                              (&pQVar2->super_QSharedData + (long)rhs.d * 4),ForOrdering);
    uVar4 = (ulong)uVar3;
  }
  uVar5 = (ulong)(byte)((char)(uVar4 >> 0x18) >> 7 | 1);
  if ((int)uVar4 == 0) {
    uVar5 = uVar4;
  }
  return (strong_ordering)(CompareUnderlyingType)uVar5;
}

Assistant:

const T *data() const noexcept { return ptr; }